

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotHLines<float>(char *label_id,float *ys,int count,int offset,int stride)

{
  float fVar1;
  ImPlotRange IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  undefined1 auVar5 [16];
  double dVar6;
  ulong uVar7;
  undefined1 auVar8 [12];
  ImPlotRange *pIVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col;
  ImDrawList *DrawList;
  int i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ImPlotRange in_XMM4;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ImPlotLimits lims;
  TransformerLinLin local_8c;
  GetterXRefYs<float> local_88;
  GetterXRefYs<float> local_68;
  ImPlotLimits local_48;
  
  bVar11 = BeginItem(label_id,0);
  if (bVar11) {
    GetPlotLimits(&local_48,-1);
    pIVar10 = GImPlot;
    local_68.XRef = local_48.X.Min;
    if (count == 0) {
      local_88.Offset = 0;
    }
    else {
      local_88.Offset = (offset % count + count) % count;
    }
    local_88.XRef = local_48.X.Max;
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar4 = GImPlot->CurrentPlot;
      iVar3 = pIVar4->CurrentYAxis;
      pIVar9 = GImPlot->ExtentsY;
      iVar12 = 0;
      do {
        fVar1 = *(float *)((long)ys +
                          (long)(((local_88.Offset + iVar12) % count + count) % count) *
                          (long)stride);
        dVar6 = (double)fVar1;
        if (((long)ABS(dVar6) < 0x7ff0000000000000) &&
           ((0.0 < fVar1 || ((pIVar4->YAxis[iVar3].Flags & 0x20U) == 0)))) {
          IVar2 = pIVar9[iVar3];
          auVar8._4_8_ = in_XMM4.Max;
          auVar8._0_4_ = IVar2.Min._4_4_;
          auVar15._0_8_ = auVar8._0_8_ << 0x20;
          auVar15._8_4_ = IVar2.Max._0_4_;
          auVar15._12_4_ = IVar2.Max._4_4_;
          uVar13 = -(ulong)(dVar6 < IVar2.Min);
          uVar14 = -(ulong)(auVar15._8_8_ < dVar6);
          uVar7 = (ulong)dVar6 & uVar14;
          auVar16._0_8_ = ~uVar13 & (ulong)IVar2.Min;
          auVar16._8_8_ = ~uVar14 & (ulong)IVar2.Max;
          auVar5._8_4_ = (int)uVar7;
          auVar5._0_8_ = (ulong)dVar6 & uVar13;
          auVar5._12_4_ = (int)(uVar7 >> 0x20);
          in_XMM4 = (ImPlotRange)(auVar16 | auVar5);
          pIVar9[iVar3] = in_XMM4;
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
    local_88.Ys = ys;
    local_88.Count = count;
    local_88.Stride = stride;
    local_68.Ys = ys;
    local_68.Count = count;
    local_68.Offset = local_88.Offset;
    local_68.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar10->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
      iVar3 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar3]) {
      case 0:
        local_8c.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLinLin>
                  (&local_68,&local_88,&local_8c,DrawList,(pIVar10->NextItemData).LineWeight,col);
        break;
      case 1:
        local_8c.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLin>
                  (&local_68,&local_88,(TransformerLogLin *)&local_8c,DrawList,
                   (pIVar10->NextItemData).LineWeight,col);
        break;
      case 2:
        local_8c.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLinLog>
                  (&local_68,&local_88,(TransformerLinLog *)&local_8c,DrawList,
                   (pIVar10->NextItemData).LineWeight,col);
        break;
      case 3:
        local_8c.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLog>
                  (&local_68,&local_88,(TransformerLogLog *)&local_8c,DrawList,
                   (pIVar10->NextItemData).LineWeight,col);
      }
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}